

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isNotInType(TokenKind kind)

{
  undefined2 in_register_0000003a;
  
  if ((((0x12 < CONCAT22(in_register_0000003a,kind) - 0x8eU) &&
       (2 < CONCAT22(in_register_0000003a,kind) - 0xcaU)) &&
      (CONCAT22(in_register_0000003a,kind) != 1)) && (CONCAT22(in_register_0000003a,kind) != 0x13))
  {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isNotInType(TokenKind kind) {
    switch (kind) {
        case TokenKind::Semicolon:
        case TokenKind::EndOfFile:
            return true;
        default:
            return isEndKeyword(kind);
    }
}